

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fzn-chuffed.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  char **in_RSI;
  int in_EDI;
  ulong uVar2;
  long lVar3;
  vec<BoolView> ng;
  string filename;
  string commandLine;
  int local_b4;
  string local_b0;
  char **local_90;
  vec<BoolView> local_88;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_b4 = in_EDI;
  local_90 = in_RSI;
  if (0 < in_EDI) {
    lVar3 = 0;
    do {
      if (lVar3 != 0) {
        std::__cxx11::string::append((char *)&local_50);
      }
      std::__cxx11::string::append((char *)&local_50);
      lVar3 = lVar3 + 1;
    } while (lVar3 < local_b4);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"fzn","");
  parseOptions(&local_b4,&local_90,&local_70,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_b4 == 1) {
    if (local_70._M_string_length == 0) {
      FlatZinc::solve((istream *)&std::cin,(ostream *)&std::cerr);
    }
    else {
      FlatZinc::solve(&local_70,(ostream *)&std::cerr);
    }
    signal(2,SIGINT_handler);
    Engine::set_assumptions(&engine,(vec<BoolView> *)(FlatZinc::s + 0x10));
    if ((engine.opt_var == (IntVar *)0x0) || (so.nof_solutions == 0)) {
      Engine::solve(&engine,FlatZinc::s,&local_50);
    }
    else {
      engine.output_stream = (ostream *)(output_buffer_abi_cxx11_ + 0x10);
      Engine::solve(&engine,FlatZinc::s,&local_50);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    if (engine.status == RES_LUN) {
      local_88.sz = 0;
      local_88.cap = 0;
      local_88.data = (BoolView *)0x0;
      Engine::retrieve_assumption_nogood(&local_88);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"% [",3);
      if (local_88.sz != 0) {
        get_bv_string_abi_cxx11_(&local_b0,local_88.data,so.assump_int);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if (1 < local_88.sz) {
          uVar2 = 1;
          lVar3 = 0x10;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
            get_bv_string_abi_cxx11_
                      (&local_b0,
                       (BoolView *)
                       ((long)&((local_88.data)->super_Var).super_Branching._vptr_Branching + lVar3)
                       ,so.assump_int);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_b0._M_dataplus._M_p,local_b0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            uVar2 = uVar2 + 1;
            lVar3 = lVar3 + 0x10;
          } while (uVar2 < (local_88._0_8_ & 0xffffffff));
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
      local_b0._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_b0,1);
      vec<BoolView>::~vec(&local_88);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,*local_90);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": unrecognized option ",0x16);
  poVar1 = std::operator<<(poVar1,local_90[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = std::operator<<((ostream *)&std::cerr,*local_90);
  std::operator<<(poVar1,": use --help for more information.\n");
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
	try {
		// Make a copy of the arguments for posterity.
		std::string commandLine;
		for (int i = 0; i < argc; i++) {
			if (i > 0) {
				commandLine += " ";
			}
			commandLine += argv[i];
		}

		// if (argc == 2 && strcmp(argv[1], "--version") == 0) {
		//   std::cout << versionString << "\n";
		//   return 0;
		// }

		std::string filename;
		parseOptions(argc, argv, &filename, "fzn");

		if (argc != 1) {
			std::cerr << argv[0] << ": unrecognized option " << argv[1] << "\n";
			std::cerr << argv[0] << ": use --help for more information.\n";
			std::exit(EXIT_FAILURE);
		}

		if (filename.empty()) {
			FlatZinc::solve(std::cin, std::cerr);
		} else {
			FlatZinc::solve(filename);
		}

		// Install signal handler
#ifdef WIN32
		SetConsoleCtrlHandler((PHANDLER_ROUTINE)SIGINT_handler, true);
#else
		// TODO: Make signal handler use C linkage
		std::signal(SIGINT, SIGINT_handler);  // NOLINT(bugprone-signal-handler)
#endif

		engine.set_assumptions(FlatZinc::s->assumptions);
		if (engine.opt_var != nullptr && so.nof_solutions != 0) {
			engine.setOutputStream(output_buffer);
			engine.solve(FlatZinc::s, commandLine);
			std::cout << output_buffer.str();
		} else {
			engine.solve(FlatZinc::s, commandLine);
		}

		if (engine.status == RES_LUN) {
			vec<BoolView> ng;
			Engine::retrieve_assumption_nogood(ng);
			std::cout << "% [";
			if (ng.size() > 0) {
				std::cout << get_bv_string(ng[0], so.assump_int);
				for (unsigned int ii = 1; ii < ng.size(); ii++) {
					std::cout << ", " << get_bv_string(ng[ii], so.assump_int);
				}
			}
			std::cout << "]" << '\n';
		}
	} catch (const std::exception& e) {
		std::cerr << e.what() << '\n';
		std::exit(EXIT_FAILURE);
	} catch (const FlatZinc::Error& e) {
		std::cerr << e.toString() << '\n';
		std::exit(EXIT_FAILURE);
	} catch (...) {
		std::cerr << "  UNKNOWN EXCEPTION." << '\n';
		std::exit(EXIT_FAILURE);
	}
	return 0;
}